

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int IDASetLinearSolutionScalingB(void *ida_mem,int which,int onoffB)

{
  int retval;
  void *ida_memB;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  IDAadjMem in_stack_ffffffffffffffc8;
  long local_30;
  IDALsMemB *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = idaLs_AccessLMemB(in_stack_ffffffffffffffc8,
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                              (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb0,(IDAadjMem *)&stack0xffffffffffffffc8,
                              (IDABMem *)0x1376ae,in_stack_ffffffffffffffe0);
  if (local_4 == 0) {
    local_4 = IDASetLinearSolutionScaling
                        (in_stack_ffffffffffffffc8,
                         (int)((ulong)*(undefined8 *)(local_30 + 0x10) >> 0x20));
  }
  return local_4;
}

Assistant:

int IDASetLinearSolutionScalingB(void* ida_mem, int which, sunbooleantype onoffB)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* access relevant memory structures */
  retval = idaLs_AccessLMemB(ida_mem, which, "IDASetLinearSolutionScalingB",
                             &IDA_mem, &IDAADJ_mem, &IDAB_mem, &idalsB_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call corresponding routine for IDAB_mem structure */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  return (IDASetLinearSolutionScaling(ida_memB, onoffB));
}